

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,bool passive)

{
  char *pcVar1;
  Offset OVar2;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> _Var3;
  size_t sVar4;
  undefined1 auStack_b8 [8];
  Location loc_1;
  Location loc;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_40;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_> field
  ;
  
  loc_1.field_1._8_8_ = 0;
  pcVar1 = this->filename_;
  strlen(pcVar1);
  loc_1.field_1._8_8_ = pcVar1;
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location>
            ((wabt *)&local_40,(Location *)((long)&loc_1.field_1 + 8));
  _Var3._M_head_impl = local_40._M_head_impl;
  loc_1.filename.size_._0_4_ = 0;
  loc_1.filename.size_._4_4_ = 0;
  loc_1.field_1.field_0.line = 0;
  auStack_b8 = (undefined1  [8])0x0;
  loc_1.filename.data_._0_4_ = 0;
  loc_1.filename.data_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  loc_1.filename.data_._0_4_ = (undefined4)sVar4;
  loc_1.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.filename.size_._0_4_ = (undefined4)OVar2;
  loc_1.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
  auStack_b8 = (undefined1  [8])pcVar1;
  Var::Var((Var *)((long)&loc_1.field_1 + 8),table_index,(Location *)auStack_b8);
  Var::operator=(&((_Var3._M_head_impl)->elem_segment).table_var,(Var *)((long)&loc_1.field_1 + 8));
  Var::~Var((Var *)((long)&loc_1.field_1 + 8));
  ((_Var3._M_head_impl)->elem_segment).passive = passive;
  field._M_t.
  super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
          )local_40._M_head_impl;
  local_40._M_head_impl = (ElemSegmentModuleField *)0x0;
  Module::AppendField(this->module_,&field);
  if ((__uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
       )field._M_t.
        super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
        .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
       )0x0) {
    (**(code **)(*(long *)field._M_t.
                          super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl
                + 8))();
  }
  field._M_t.
  super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
        )(__uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
          )0x0;
  if (local_40._M_head_impl != (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        bool passive) {
  auto field = MakeUnique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  elem_segment.passive = passive;
  module_->AppendField(std::move(field));
  return Result::Ok;
}